

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_truetype.h
# Opt level: O2

stbtt_uint32 stbtt__find_table(stbtt_uint8 *data,stbtt_uint32 fontstart,char *tag)

{
  ushort uVar1;
  stbtt_uint32 sVar2;
  ulong uVar3;
  uint uVar4;
  bool bVar5;
  
  uVar1 = swap_bytes(*(undefined2 *)(data + (ulong)fontstart + 4));
  uVar4 = fontstart + 0xc;
  uVar3 = (ulong)uVar1;
  while( true ) {
    bVar5 = uVar3 == 0;
    uVar3 = uVar3 - 1;
    if (bVar5) {
      return 0;
    }
    if (((((uint)data[uVar4] == (int)*tag) && ((uint)data[(ulong)uVar4 + 1] == (int)tag[1])) &&
        ((uint)data[(ulong)uVar4 + 2] == (int)tag[2])) &&
       ((uint)data[(ulong)uVar4 + 3] == (int)tag[3])) break;
    uVar4 = uVar4 + 0x10;
  }
  sVar2 = ttULONG(data + (ulong)uVar4 + 8);
  return sVar2;
}

Assistant:

static stbtt_uint32 stbtt__find_table(stbtt_uint8 *data, stbtt_uint32 fontstart, const char *tag)
{
   stbtt_int32 num_tables = ttUSHORT(data+fontstart+4);
   stbtt_uint32 tabledir = fontstart + 12;
   stbtt_int32 i;
   for (i=0; i < num_tables; ++i) {
      stbtt_uint32 loc = tabledir + 16*i;
      if (stbtt_tag(data+loc+0, tag))
         return ttULONG(data+loc+8);
   }
   return 0;
}